

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  Vec_Ptr_t *vRoots_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsNode(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x170,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    __assert_fail("Abc_NodeIsTravIdCurrent(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x171,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_ObjFanout(pObj,local_24);
    iVar1 = Abc_NodeIsTravIdCurrent(pAVar2);
    if (iVar1 == 0) break;
  }
  iVar1 = Abc_ObjFanoutNum(pObj);
  if (local_24 < iVar1) {
    Vec_PtrPushUnique(vRoots,pObj);
  }
  else {
    for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = Abc_ObjFanout(pObj,local_24);
      Abc_NtkDontCareWinCollectRoots_rec(pAVar2,vRoots);
    }
  }
  return;
}

Assistant:

void Abc_NtkDontCareWinCollectRoots_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pObj) );
    assert( Abc_NodeIsTravIdCurrent(pObj) );
    // check if the node has all fanouts marked
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            break;
    // if some of the fanouts are unmarked, add the node to the root
    if ( i < Abc_ObjFanoutNum(pObj) ) 
    {
        Vec_PtrPushUnique( vRoots, pObj );
        return;
    }
    // otherwise, call recursively
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_NtkDontCareWinCollectRoots_rec( pFanout, vRoots );
}